

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodExceptionText.cpp
# Opt level: O0

string * __thiscall
oout::MethodExceptionText::asString_abi_cxx11_
          (string *__return_storage_ptr__,MethodExceptionText *this)

{
  runtime_error *this_00;
  exception *e;
  MethodExceptionText *this_local;
  
  std::function<void_()>::operator()(&this->invoker);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Class method don\'t throw exception");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

string MethodExceptionText::asString() const
{
	try {
		invoker();
	} catch (const exception &e) {
		return e.what();
	}
	throw runtime_error("Class method don't throw exception");
}